

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<long,long,long,long>
               (ostream *out,char *fmt,long *args,long *args_1,long *args_2,long *args_3)

{
  FormatListN<4> local_a8;
  long *local_38;
  long *args_local_3;
  long *args_local_2;
  long *args_local_1;
  long *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_38 = args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (long *)fmt;
  fmt_local = (char *)out;
  makeFormatList<long,long,long,long>(&local_a8,(tinyformat *)args,args_1,args_2,args_3,args_3);
  vformat(out,fmt,&local_a8.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}